

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

int64_t av1_pixel_diff_dist(MACROBLOCK *x,int plane,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                           BLOCK_SIZE tx_bsize,uint *block_mse_q8)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000089;
  ulong uVar8;
  
  uVar8 = CONCAT71(in_register_00000089,tx_bsize) & 0xffffffff;
  bVar1 = block_size_high[uVar8];
  iVar2 = (x->e_mbd).mb_to_bottom_edge;
  uVar7 = (uint)bVar1;
  if (iVar2 < 0) {
    uVar5 = (uint)block_size_high[plane_bsize] + blk_row * -4 +
            (iVar2 >> ((char)(x->e_mbd).plane[plane].subsampling_y + 3U & 0x1f));
    if ((int)uVar5 < (int)(uint)bVar1) {
      uVar7 = uVar5;
    }
    if ((int)uVar5 < 0) {
      uVar7 = 0;
    }
  }
  bVar1 = block_size_wide[uVar8];
  iVar2 = (x->e_mbd).mb_to_right_edge;
  uVar5 = (uint)bVar1;
  if (iVar2 < 0) {
    bVar3 = (char)(x->e_mbd).plane[plane].subsampling_x + 3U & 0x1f;
    uVar6 = (uint)block_size_wide[plane_bsize] + blk_col * -4 + (iVar2 >> bVar3);
    if ((int)uVar6 < (int)(uint)bVar1) {
      uVar5 = uVar6;
    }
    if ((int)uVar6 < 0) {
      uVar5 = 0 >> bVar3;
    }
  }
  uVar4 = (*aom_sum_squares_2d_i16)
                    (x->plane[plane].src_diff +
                     (int)((blk_row * (uint)block_size_wide[plane_bsize] + blk_col) * 4),
                     (int)block_size_wide[plane_bsize],uVar5,uVar7);
  if (block_mse_q8 != (uint *)0x0) {
    uVar6 = 0xffffffff;
    if ((0 < (int)uVar5) && (0 < (int)uVar7)) {
      uVar6 = (uint)((uVar4 << 8) / (ulong)(uVar5 * uVar7));
    }
    *block_mse_q8 = uVar6;
  }
  return uVar4;
}

Assistant:

int64_t av1_pixel_diff_dist(const MACROBLOCK *x, int plane, int blk_row,
                            int blk_col, const BLOCK_SIZE plane_bsize,
                            const BLOCK_SIZE tx_bsize,
                            unsigned int *block_mse_q8) {
  int visible_rows, visible_cols;
  const MACROBLOCKD *xd = &x->e_mbd;
  get_txb_dimensions(xd, plane, plane_bsize, blk_row, blk_col, tx_bsize, NULL,
                     NULL, &visible_cols, &visible_rows);
  const int diff_stride = block_size_wide[plane_bsize];
  const int16_t *diff = x->plane[plane].src_diff;

  diff += ((blk_row * diff_stride + blk_col) << MI_SIZE_LOG2);
  uint64_t sse =
      aom_sum_squares_2d_i16(diff, diff_stride, visible_cols, visible_rows);
  if (block_mse_q8 != NULL) {
    if (visible_cols > 0 && visible_rows > 0)
      *block_mse_q8 =
          (unsigned int)((256 * sse) / (visible_cols * visible_rows));
    else
      *block_mse_q8 = UINT_MAX;
  }
  return sse;
}